

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

void __thiscall OPL3::OPL3(OPL3 *this,bool fullpan)

{
  int iVar1;
  bool bVar2;
  OPL3DataStruct *this_00;
  OperatorDataStruct *this_01;
  long lVar3;
  long lVar4;
  undefined7 in_register_00000031;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_006ef240;
  (this->disabledChannel).super_Channel.cnt = 0;
  (this->disabledChannel).super_Channel.channelBaseAddress = 0;
  (this->disabledChannel).super_Channel.feedback[0] = 0.0;
  (this->disabledChannel).super_Channel.feedback[1] = 0.0;
  (this->disabledChannel).super_Channel.fnuml = 0;
  (this->disabledChannel).super_Channel.fnumh = 0;
  (this->disabledChannel).super_Channel.kon = 0;
  (this->disabledChannel).super_Channel.block = 0;
  (this->disabledChannel).super_Channel.fb = 0;
  (this->disabledChannel).super_Channel.leftPan = 0.0;
  (this->disabledChannel).super_Channel.rightPan = 0.0;
  (this->disabledChannel).super_Channel._vptr_Channel = (_func_int **)&PTR__Channel_006ef448;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.phaseGenerator.phase = 0.0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.phaseGenerator.phaseIncrement = 0.0
  ;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.stage = OFF;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.actualAttackRate
       = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.actualDecayRate =
       0;
  *(undefined8 *)
   &(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
    actualReleaseRate = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           xAttackIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           xMinimumInAttack + 4) = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           dBdecayIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           dBreleaseIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           attenuation + 4) = 0;
  *(undefined8 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           totalLevel + 4) = 0;
  *(undefined4 *)
   ((long)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.
           sustainLevel + 4) = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.x =
       6.584962500721156;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelopeGenerator.envelope = -96.0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.operatorBaseAddress = 0x11;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.envelope = 0.0;
  (this->snareDrumOperator).super_Operator.phaseGenerator.phase = 0.0;
  (this->snareDrumOperator).super_Operator.phaseGenerator.phaseIncrement = 0.0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.keyScaleNumber = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.f_number = 0;
  *(undefined8 *)&(this->highHatOperator).super_TopCymbalOperator.super_Operator.block = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.dr = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.sl = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.rr = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.ws = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.mult = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.ksl = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.tl = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.ar = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.am = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.vib = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.ksr = 0;
  (this->highHatOperator).super_TopCymbalOperator.super_Operator.egt = 0;
  (this->snareDrumOperator).super_Operator.envelopeGenerator.stage = OFF;
  (this->snareDrumOperator).super_Operator.envelopeGenerator.actualAttackRate = 0;
  (this->snareDrumOperator).super_Operator.envelopeGenerator.actualDecayRate = 0;
  *(undefined8 *)&(this->snareDrumOperator).super_Operator.envelopeGenerator.actualReleaseRate = 0;
  *(undefined8 *)
   ((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.xAttackIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.xMinimumInAttack + 4) = 0;
  *(undefined8 *)
   ((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.dBdecayIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.dBreleaseIncrement + 4) = 0;
  *(undefined8 *)((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.attenuation + 4)
       = 0;
  *(undefined8 *)((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.totalLevel + 4)
       = 0;
  *(undefined4 *)
   ((long)&(this->snareDrumOperator).super_Operator.envelopeGenerator.sustainLevel + 4) = 0;
  (this->snareDrumOperator).super_Operator.envelopeGenerator.x = 6.584962500721156;
  (this->snareDrumOperator).super_Operator.envelopeGenerator.envelope = -96.0;
  (this->snareDrumOperator).super_Operator.operatorBaseAddress = 0x14;
  (this->snareDrumOperator).super_Operator.envelope = 0.0;
  (this->snareDrumOperator).super_Operator.am = 0;
  (this->snareDrumOperator).super_Operator.vib = 0;
  (this->snareDrumOperator).super_Operator.ksr = 0;
  (this->snareDrumOperator).super_Operator.egt = 0;
  (this->snareDrumOperator).super_Operator.mult = 0;
  (this->snareDrumOperator).super_Operator.ksl = 0;
  (this->snareDrumOperator).super_Operator.tl = 0;
  (this->snareDrumOperator).super_Operator.ar = 0;
  (this->snareDrumOperator).super_Operator.dr = 0;
  (this->snareDrumOperator).super_Operator.sl = 0;
  (this->snareDrumOperator).super_Operator.rr = 0;
  (this->snareDrumOperator).super_Operator.ws = 0;
  (this->snareDrumOperator).super_Operator.keyScaleNumber = 0;
  (this->snareDrumOperator).super_Operator.f_number = 0;
  *(undefined8 *)&(this->snareDrumOperator).super_Operator.block = 0;
  (this->tomTomOperator).super_Operator.phaseGenerator.phase = 0.0;
  (this->tomTomOperator).super_Operator.phaseGenerator.phaseIncrement = 0.0;
  (this->tomTomOperator).super_Operator.envelopeGenerator.stage = OFF;
  *(undefined4 *)((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.sustainLevel + 4) =
       0;
  *(undefined8 *)((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.attenuation + 4) =
       0;
  *(undefined8 *)((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.totalLevel + 4) = 0
  ;
  *(undefined8 *)
   ((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.dBdecayIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.dBreleaseIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.xAttackIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tomTomOperator).super_Operator.envelopeGenerator.xMinimumInAttack + 4) = 0;
  (this->tomTomOperator).super_Operator.envelopeGenerator.actualAttackRate = 0;
  (this->tomTomOperator).super_Operator.envelopeGenerator.actualDecayRate = 0;
  *(undefined8 *)&(this->tomTomOperator).super_Operator.envelopeGenerator.actualReleaseRate = 0;
  (this->tomTomOperator).super_Operator.envelopeGenerator.x = 6.584962500721156;
  (this->tomTomOperator).super_Operator.envelopeGenerator.envelope = -96.0;
  (this->tomTomOperator).super_Operator.operatorBaseAddress = 0x12;
  (this->tomTomOperator).super_Operator.envelope = 0.0;
  (this->tomTomOperator).super_Operator.am = 0;
  (this->tomTomOperator).super_Operator.vib = 0;
  (this->tomTomOperator).super_Operator.ksr = 0;
  (this->tomTomOperator).super_Operator.egt = 0;
  (this->tomTomOperator).super_Operator.mult = 0;
  (this->tomTomOperator).super_Operator.ksl = 0;
  (this->tomTomOperator).super_Operator.tl = 0;
  (this->tomTomOperator).super_Operator.ar = 0;
  (this->tomTomOperator).super_Operator.dr = 0;
  (this->tomTomOperator).super_Operator.sl = 0;
  (this->tomTomOperator).super_Operator.rr = 0;
  (this->tomTomOperator).super_Operator.ws = 0;
  (this->tomTomOperator).super_Operator.ws = 0;
  (this->tomTomOperator).super_Operator.keyScaleNumber = 0;
  (this->tomTomOperator).super_Operator.f_number = 0;
  (this->tomTomOperator).super_Operator.block = 0;
  if ((int)CONCAT71(in_register_00000031,fullpan) == 0) {
    uVar6 = 0;
    uVar7 = 0x3ff00000;
  }
  else {
    uVar6 = 0x667e556e;
    uVar7 = 0x3fe6a09e;
  }
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.cnt = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.
  channelBaseAddress = 8;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fb = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnuml = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnumh = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.kon = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.block = 0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[0] =
       0.0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[1] =
       0.0;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.rightPan =
       (double)CONCAT44(uVar7,uVar6);
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel.leftPan =
       (double)CONCAT44(uVar7,uVar6);
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.op1 =
       &(this->tomTomOperator).super_Operator;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.op2 =
       &(this->topCymbalOperator).super_Operator;
  (this->tomTomTopCymbalChannel).super_RhythmChannel.super_Channel2op.super_Channel._vptr_Channel =
       (_func_int **)&PTR__Channel_006ef4a0;
  BassDrumChannel::BassDrumChannel(&this->bassDrumChannel,(double)CONCAT44(uVar7,uVar6));
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.cnt = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.
  channelBaseAddress = 7;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[0] =
       0.0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.feedback[1] =
       0.0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnuml = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fnumh = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.kon = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.block = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.fb = 0;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.rightPan =
       (double)CONCAT44(uVar7,uVar6);
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel.leftPan =
       (double)CONCAT44(uVar7,uVar6);
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.op1 =
       (Operator *)&this->highHatOperator;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.op2 =
       &(this->snareDrumOperator).super_Operator;
  (this->highHatSnareDrumChannel).super_RhythmChannel.super_Channel2op.super_Channel._vptr_Channel =
       (_func_int **)&PTR__Channel_006ef4f8;
  (this->topCymbalOperator).super_Operator.phaseGenerator.phase = 0.0;
  (this->topCymbalOperator).super_Operator.phaseGenerator.phaseIncrement = 0.0;
  (this->topCymbalOperator).super_Operator.envelopeGenerator.stage = OFF;
  (this->topCymbalOperator).super_Operator.envelopeGenerator.actualAttackRate = 0;
  (this->topCymbalOperator).super_Operator.envelopeGenerator.actualDecayRate = 0;
  *(undefined8 *)&(this->topCymbalOperator).super_Operator.envelopeGenerator.actualReleaseRate = 0;
  *(undefined8 *)
   ((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.xAttackIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.xMinimumInAttack + 4) = 0;
  *(undefined8 *)
   ((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.dBdecayIncrement + 4) = 0;
  *(undefined8 *)
   ((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.dBreleaseIncrement + 4) = 0;
  *(undefined8 *)((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.attenuation + 4)
       = 0;
  *(undefined8 *)((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.totalLevel + 4)
       = 0;
  *(undefined4 *)
   ((long)&(this->topCymbalOperator).super_Operator.envelopeGenerator.sustainLevel + 4) = 0;
  (this->topCymbalOperator).super_Operator.envelopeGenerator.x = 6.584962500721156;
  (this->topCymbalOperator).super_Operator.envelopeGenerator.envelope = -96.0;
  (this->topCymbalOperator).super_Operator.operatorBaseAddress = 0x15;
  (this->topCymbalOperator).super_Operator.envelope = 0.0;
  (this->topCymbalOperator).super_Operator.ws = 0;
  (this->topCymbalOperator).super_Operator.keyScaleNumber = 0;
  (this->topCymbalOperator).super_Operator.f_number = 0;
  (this->topCymbalOperator).super_Operator.block = 0;
  (this->topCymbalOperator).super_Operator.dr = 0;
  (this->topCymbalOperator).super_Operator.sl = 0;
  (this->topCymbalOperator).super_Operator.rr = 0;
  (this->topCymbalOperator).super_Operator.ws = 0;
  (this->topCymbalOperator).super_Operator.mult = 0;
  (this->topCymbalOperator).super_Operator.ksl = 0;
  (this->topCymbalOperator).super_Operator.tl = 0;
  (this->topCymbalOperator).super_Operator.ar = 0;
  (this->topCymbalOperator).super_Operator.am = 0;
  (this->topCymbalOperator).super_Operator.vib = 0;
  (this->topCymbalOperator).super_Operator.ksr = 0;
  (this->topCymbalOperator).super_Operator.egt = 0;
  this->FullPan = fullpan;
  this->tremoloIndex = 0;
  this->hh = 0;
  this->_new = 0;
  this->connectionsel = 0;
  this->vibratoIndex = 0;
  this->bd = 0;
  this->sd = 0;
  this->tom = 0;
  this->tc = 0;
  this->nts = 0;
  this->dam = 0;
  this->dvb = 0;
  this->ryt = 0;
  iVar1 = InstanceCount + 1;
  bVar5 = InstanceCount == 0;
  InstanceCount = iVar1;
  if (bVar5) {
    this_00 = (OPL3DataStruct *)operator_new(0x547c0);
    OPL3DataStruct::loadVibratoTable(this_00);
    OPL3DataStruct::loadTremoloTable(this_00);
    OPL3Data = this_00;
    this_01 = (OperatorDataStruct *)operator_new(0x11c00);
    OperatorDataStruct::OperatorDataStruct(this_01);
    OperatorData = this_01;
  }
  initOperators(this);
  initChannels2op(this);
  initChannels4op(this);
  lVar3 = 0;
  bVar5 = true;
  do {
    bVar2 = bVar5;
    lVar4 = 0;
    do {
      this->channels[lVar3][lVar4] = &this->channels2op[lVar3][lVar4]->super_Channel;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 9);
    lVar3 = 1;
    bVar5 = false;
  } while (bVar2);
  return;
}

Assistant:

OPL3::OPL3(bool fullpan)
: tomTomTopCymbalChannel(fullpan ? CENTER_PANNING_POWER : 1, &tomTomOperator, &topCymbalOperator),
  bassDrumChannel(fullpan ? CENTER_PANNING_POWER : 1),
  highHatSnareDrumChannel(fullpan ? CENTER_PANNING_POWER : 1, &highHatOperator, &snareDrumOperator)
{
	FullPan = fullpan;
    nts = dam = dvb = ryt = bd = sd = tom = tc = hh = _new = connectionsel = 0;
    vibratoIndex = tremoloIndex = 0; 

	if (InstanceCount++ == 0)
	{
		OPL3Data = new struct OPL3DataStruct;
		OperatorData = new struct OperatorDataStruct;
	}

    initOperators();
    initChannels2op();
    initChannels4op();
    initRhythmChannels();
    initChannels();
}